

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O3

void __thiscall
glcts::SampleShadingRenderFormatTests::SampleShadingRenderFormatTests
          (SampleShadingRenderFormatTests *this,Context *context,GLSLVersion glslVersion,
          GLenum internalFormat,char *format,TextureFormat *texFormat,char *sampler,char *outType,
          GLfloat min,GLfloat max,char *extension)

{
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  GLfloat local_38;
  GLfloat local_34;
  
  local_38 = min;
  local_34 = max;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,format,fixed_sample_locations_values + 1);
  (this->super_TestCaseGroup).m_context = context;
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SampleShadingRenderFormatTests_020fddb8;
  this->m_glslVersion = glslVersion;
  this->m_internalFormat = internalFormat;
  this->m_texFormat = *texFormat;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_sampler,sampler,&local_39);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_outType,outType,&local_3a);
  this->m_min = local_38;
  this->m_max = local_34;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_extension,extension,&local_3b);
  return;
}

Assistant:

SampleShadingRenderFormatTests::SampleShadingRenderFormatTests(Context& context, glu::GLSLVersion glslVersion,
															   GLenum internalFormat, const char* format,
															   tcu::TextureFormat const& texFormat, const char* sampler,
															   const char* outType, GLfloat min, GLfloat max,
															   const char* extension)
	: TestCaseGroup(context, format, "")
	, m_glslVersion(glslVersion)
	, m_internalFormat(internalFormat)
	, m_texFormat(texFormat)
	, m_sampler(sampler)
	, m_outType(outType)
	, m_min(min)
	, m_max(max)
	, m_extension(extension)
{
}